

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvacounter.c
# Opt level: O2

void print_poll_data(char *name,uint8_t *signals)

{
  ulong uVar1;
  ulong uVar2;
  
  printf("Print data poll \'%s\':\n",name);
  for (uVar1 = 0; uVar1 != 8; uVar1 = uVar1 + 1) {
    printf("Set %i:",uVar1 & 0xffffffff);
    for (uVar2 = 0; uVar2 != 0x100; uVar2 = uVar2 + 1) {
      if ((uVar2 & 0xf) == 0) {
        printf("\n0x%02x: ",uVar2 & 0xffffffff);
      }
      printf("%.3i ",(ulong)signals[uVar2]);
    }
    if (uVar1 != 7) {
      putchar(10);
    }
    putchar(10);
    signals = signals + 0x100;
  }
  return;
}

Assistant:

void print_poll_data(const char *name, uint8_t *signals)
{
	int i, s;

	printf("Print data poll '%s':\n", name);
	for (s = 0; s < 8; s++) {
		printf("Set %i:", s);
		for (i = 0; i < 0x20 * 8; i++) {
			if (i % 0x10 == 0)
				printf("\n0x%02x: ", i % (0x20 * 8));

			printf("%.3i ", SIGNAL_VALUE(signals, s, i));

			if (i != 0 && i % (SIGNALS_LENGTH) == 0)
				printf("\n\n");
		}

		if (s != 7)
			printf("\n");
		printf("\n");
	}
}